

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *
flat_filter<docopt::Option_const>
          (vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
           *__return_storage_ptr__,Pattern *pattern)

{
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> flattened;
  _Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> local_28;
  
  (**pattern->_vptr_Pattern)
            (&local_28,pattern,
             flat_filter<docopt::Option_const>(docopt::Pattern&)::{lambda(docopt::Pattern_const*)#1}
             ::Pattern_const__);
  (__return_storage_ptr__->
  super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  transform<__gnu_cxx::__normal_iterator<docopt::Pattern**,std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>>,std::back_insert_iterator<std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>>,flat_filter<docopt::Option_const>(docopt::Pattern&)::_lambda(docopt::Pattern*)_1_>
            (local_28._M_impl.super__Vector_impl_data._M_start,
             local_28._M_impl.super__Vector_impl_data._M_finish,__return_storage_ptr__);
  std::_Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::~_Vector_base(&local_28)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> flat_filter(Pattern& pattern) {
	std::vector<Pattern*> flattened = pattern.flat([](Pattern const* p) -> bool {
		return dynamic_cast<T const*>(p);
	});
	
	// now, we're guaranteed to have T*'s, so just use static_cast
	std::vector<T*> ret;
	std::transform(flattened.begin(), flattened.end(), std::back_inserter(ret), [](Pattern* p) {
		return static_cast<T*>(p);
	});
	return ret;
}